

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

void __thiscall
tf::ObjectPool<tf::Node,_65536UL>::ObjectPool(ObjectPool<tf::Node,_65536UL> *this,uint t)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  reference pLVar4;
  ulong local_50;
  size_t i;
  LocalHeap *h;
  iterator __end0;
  iterator __begin0;
  vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>
  *__range2;
  allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap> local_15;
  uint local_14;
  ObjectPool<tf::Node,_65536UL> *pOStack_10;
  uint t_local;
  ObjectPool<tf::Node,_65536UL> *this_local;
  
  local_14 = t;
  pOStack_10 = this;
  uVar3 = _next_pow2(this,t * 2 + 2);
  this->_lheap_mask = (ulong)(uVar3 - 1);
  GlobalHeap::GlobalHeap(&this->_gheap);
  sVar1 = this->_lheap_mask;
  std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>::allocator(&local_15);
  std::
  vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>
  ::vector(&this->_lheaps,sVar1 + 1,&local_15);
  std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>::~allocator(&local_15);
  _blocklist_init_head(this,&(this->_gheap).list);
  __end0 = std::
           vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>
           ::begin(&this->_lheaps);
  h = (LocalHeap *)
      std::
      vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>
      ::end(&this->_lheaps);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap_*,_std::vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>_>
                      (&__end0,(__normal_iterator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap_*,_std::vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>_>
                                *)&h);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pLVar4 = __gnu_cxx::
             __normal_iterator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap_*,_std::vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>_>
             ::operator*(&__end0);
    for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
      _blocklist_init_head(this,pLVar4->lists + local_50);
    }
    __gnu_cxx::
    __normal_iterator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap_*,_std::vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

ObjectPool<T, S>::ObjectPool(unsigned t) :
  //_heap_mask   {(_next_pow2(t) << 1) - 1u},
  //_heap_mask   { _next_pow2(t<<1) - 1u },
  //_heap_mask   {(t << 1) - 1},
  _lheap_mask { _next_pow2((t+1) << 1) - 1 },
  _lheaps     { _lheap_mask + 1 } {

  _blocklist_init_head(&_gheap.list);

  for(auto& h : _lheaps) {
    for(size_t i=0; i<B; ++i) {
      _blocklist_init_head(&h.lists[i]);
    }
  }
}